

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

void __thiscall QPDF::insertXrefEntry(QPDF *this,int obj,int f0,qpdf_offset_t f1,int f2)

{
  _Base_ptr p_Var1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  _Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_> _Var6;
  long *plVar7;
  QPDFExc *__return_storage_ptr__;
  _Base_ptr p_Var8;
  size_type *psVar9;
  _Base_ptr p_Var10;
  int iVar11;
  uint __len;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_bool> pVar12;
  string local_110;
  string local_f0;
  long *local_d0 [2];
  long local_c0 [2];
  QPDFExc local_b0;
  
  local_b0._4_4_ = 0;
  if (f0 != 2) {
    local_b0._4_4_ = f2;
  }
  if ((((0 < obj) && ((int)local_b0._4_4_ < 0xffff)) && (-1 < f2)) &&
     (_Var2._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl,
     obj <= (_Var2._M_head_impl)->xref_table_max_id)) {
    p_Var1 = (_Base_ptr)((long)&(_Var2._M_head_impl)->deleted_objects + 8);
    p_Var8 = p_Var1;
    for (p_Var10 = *(_Base_ptr *)((long)&(_Var2._M_head_impl)->deleted_objects + 0x10);
        p_Var10 != (_Base_ptr)0x0;
        p_Var10 = *(_Base_ptr *)
                   ((long)&p_Var10->_M_left + (ulong)((int)p_Var10[1]._M_color < obj) * 8)) {
      if (obj <= (int)p_Var10[1]._M_color) {
        p_Var8 = p_Var10;
      }
    }
    p_Var10 = p_Var1;
    if ((p_Var8 != p_Var1) && (p_Var10 = p_Var8, obj < (int)p_Var8[1]._M_color)) {
      p_Var10 = p_Var1;
    }
    if (p_Var10 == p_Var1) {
      iVar11 = (int)f1;
      if (iVar11 == obj && f0 == 2) {
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"xref stream","");
        __len = 1;
        if (9 < (uint)obj) {
          uVar5 = 4;
          uVar4 = obj;
          do {
            __len = uVar5;
            if (uVar4 < 100) {
              __len = __len - 2;
              goto LAB_0022865d;
            }
            if (uVar4 < 1000) {
              __len = __len - 1;
              goto LAB_0022865d;
            }
            if (uVar4 < 10000) goto LAB_0022865d;
            bVar3 = 99999 < uVar4;
            uVar5 = __len + 4;
            uVar4 = uVar4 / 10000;
          } while (bVar3);
          __len = __len + 1;
        }
LAB_0022865d:
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct((ulong)local_d0,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d0[0],__len,obj);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)local_d0,0,(char *)0x0,0x281b9c);
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_110.field_2._M_allocated_capacity = *psVar9;
          local_110.field_2._8_8_ = plVar7[3];
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110.field_2._M_allocated_capacity = *psVar9;
          local_110._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_110._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        damagedPDF(&local_b0,this,&local_f0,&local_110);
        warn(this,&local_b0);
        QPDFExc::~QPDFExc(&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if (local_d0[0] != local_c0) {
          operator_delete(local_d0[0],local_c0[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_b0._0_4_ = obj;
        pVar12 = std::
                 map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                 ::try_emplace<>(&(_Var2._M_head_impl)->xref_table,(key_type *)&local_b0);
        _Var6 = pVar12.first._M_node;
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (f0 == 2) {
            if (iVar11 != f1) {
              QIntC::IntConverter<long_long,_int,_true,_true>::error(f1);
            }
            *(undefined4 *)&_Var6._M_node[1]._M_parent = 2;
            _Var6._M_node[1]._M_left = (_Base_ptr)(long)iVar11;
            *(int *)&_Var6._M_node[1]._M_right = f2;
          }
          else {
            if (f0 != 1) {
              __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
              local_b0._0_8_ = &local_b0.error_code;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"xref stream","");
              std::__cxx11::to_string(&local_110,f0);
              std::operator+(&local_f0,"unknown xref stream entry type ",&local_110);
              damagedPDF(__return_storage_ptr__,this,(string *)&local_b0,&local_f0);
              __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
            }
            *(undefined4 *)&_Var6._M_node[1]._M_parent = 1;
            _Var6._M_node[1]._M_left = (_Base_ptr)f1;
            *(undefined4 *)&_Var6._M_node[1]._M_right = 0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
QPDF::insertXrefEntry(int obj, int f0, qpdf_offset_t f1, int f2)
{
    // Populate the xref table in such a way that the first reference to an object that we see,
    // which is the one in the latest xref table in which it appears, is the one that gets stored.
    // This works because we are reading more recent appends before older ones.

    // If there is already an entry for this object and generation in the table, it means that a
    // later xref table has registered this object.  Disregard this one.
    int new_gen = f0 == 2 ? 0 : f2;

    if (!(obj > 0 && obj <= m->xref_table_max_id && 0 <= f2 && new_gen < 65535)) {
        // We are ignoring invalid objgens. Most will arrive here from xref reconstruction. There
        // is probably no point having another warning but we could count invalid items in order to
        // decide when to give up.
        QTC::TC("qpdf", "QPDF xref overwrite invalid objgen");
        // ignore impossibly large object ids or object ids > Size.
        return;
    }

    if (m->deleted_objects.count(obj)) {
        QTC::TC("qpdf", "QPDF xref deleted object");
        return;
    }

    if (f0 == 2 && static_cast<int>(f1) == obj) {
        warn(damagedPDF("xref stream", "self-referential object stream " + std::to_string(obj)));
        return;
    }

    auto [iter, created] = m->xref_table.try_emplace(QPDFObjGen(obj, (f0 == 2 ? 0 : f2)));
    if (!created) {
        QTC::TC("qpdf", "QPDF xref reused object");
        return;
    }

    switch (f0) {
    case 1:
        // f2 is generation
        QTC::TC("qpdf", "QPDF xref gen > 0", ((f2 > 0) ? 1 : 0));
        iter->second = QPDFXRefEntry(f1);
        break;

    case 2:
        iter->second = QPDFXRefEntry(toI(f1), f2);
        break;

    default:
        throw damagedPDF("xref stream", "unknown xref stream entry type " + std::to_string(f0));
        break;
    }
}